

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O0

void * ares_dnsrec_convert_arg(ares_callback callback,void *arg)

{
  dnsrec_convert_arg_t *carg;
  void *arg_local;
  ares_callback callback_local;
  
  callback_local = (ares_callback)ares_malloc_zero(0x10);
  if (callback_local == (ares_callback)0x0) {
    callback_local = (ares_callback)0x0;
  }
  else {
    *(ares_callback *)callback_local = callback;
    *(void **)(callback_local + 8) = arg;
  }
  return callback_local;
}

Assistant:

void *ares_dnsrec_convert_arg(ares_callback callback, void *arg)
{
  dnsrec_convert_arg_t *carg = ares_malloc_zero(sizeof(*carg));
  if (carg == NULL) {
    return NULL;
  }
  carg->callback = callback;
  carg->arg      = arg;
  return carg;
}